

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,bool overwrite_dst)

{
  ImVector<unsigned_short> *this_00;
  unsigned_short uVar1;
  unsigned_short *puVar2;
  float *pfVar3;
  uint uVar4;
  uint i;
  float fVar5;
  
  this_00 = &this->IndexLookup;
  uVar4 = (this->IndexLookup).Size;
  if ((int)uVar4 < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0xb6d,"AddRemapChar","ImGui ASSERT FAILED: %s","IndexLookup.Size > 0");
    uVar4 = this_00->Size;
  }
  i = (uint)dst;
  if (dst < uVar4) {
    if ((this->IndexLookup).Data[dst] == 0xffff && !overwrite_dst) {
      return;
    }
    GrowIndex(this,dst + 1);
    if (uVar4 <= src) {
      puVar2 = ImVector<unsigned_short>::operator[](this_00,i);
      *puVar2 = 0xffff;
      fVar5 = 1.0;
      goto LAB_001aaab7;
    }
  }
  else {
    if (uVar4 <= src) {
      return;
    }
    GrowIndex(this,dst + 1);
  }
  uVar1 = (this->IndexLookup).Data[src];
  puVar2 = ImVector<unsigned_short>::operator[](this_00,i);
  *puVar2 = uVar1;
  fVar5 = (this->IndexAdvanceX).Data[src];
LAB_001aaab7:
  pfVar3 = ImVector<float>::operator[](&this->IndexAdvanceX,i);
  *pfVar3 = fVar5;
  return;
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    unsigned int index_size = (unsigned int)IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (ImWchar)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (ImWchar)-1;
    IndexAdvanceX[dst] = (src < index_size) ? IndexAdvanceX.Data[src] : 1.0f;
}